

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::SAXParser::endElement
          (SAXParser *this,XMLElementDecl *elemDecl,uint uriId,bool isRoot,XMLCh *elemPrefix)

{
  DocumentHandler *pDVar1;
  bool bVar2;
  XMLCh *pXVar3;
  ulong local_30;
  XMLSize_t index;
  XMLCh *elemPrefix_local;
  bool isRoot_local;
  uint uriId_local;
  XMLElementDecl *elemDecl_local;
  SAXParser *this_local;
  
  if (this->fDocHandler != (DocumentHandler *)0x0) {
    bVar2 = XMLScanner::getDoNamespaces(this->fScanner);
    if (bVar2) {
      if ((elemPrefix == (XMLCh *)0x0) || (*elemPrefix == L'\0')) {
        pDVar1 = this->fDocHandler;
        pXVar3 = XMLElementDecl::getBaseName(elemDecl);
        (**(code **)(*(long *)pDVar1 + 0x20))(pDVar1,pXVar3);
      }
      else {
        XMLBuffer::set(&this->fElemQNameBuf,elemPrefix);
        XMLBuffer::append(&this->fElemQNameBuf,L':');
        pXVar3 = XMLElementDecl::getBaseName(elemDecl);
        XMLBuffer::append(&this->fElemQNameBuf,pXVar3);
        pDVar1 = this->fDocHandler;
        pXVar3 = XMLBuffer::getRawBuffer(&this->fElemQNameBuf);
        (**(code **)(*(long *)pDVar1 + 0x20))(pDVar1,pXVar3);
      }
    }
    else {
      pDVar1 = this->fDocHandler;
      pXVar3 = XMLElementDecl::getFullName(elemDecl);
      (**(code **)(*(long *)pDVar1 + 0x20))(pDVar1,pXVar3);
    }
  }
  for (local_30 = 0; local_30 < this->fAdvDHCount; local_30 = local_30 + 1) {
    (*this->fAdvDHList[local_30]->_vptr_XMLDocumentHandler[6])
              (this->fAdvDHList[local_30],elemDecl,(ulong)uriId,(ulong)isRoot,elemPrefix);
  }
  if (this->fElemDepth != 0) {
    this->fElemDepth = this->fElemDepth - 1;
  }
  return;
}

Assistant:

void SAXParser::endElement( const   XMLElementDecl& elemDecl
                            , const unsigned int    uriId
                            , const bool            isRoot
                            , const XMLCh* const    elemPrefix)
{
    // Just map to the SAX document handler
    if (fDocHandler) {
        if (fScanner->getDoNamespaces()) {

            if (elemPrefix && *elemPrefix) {

                fElemQNameBuf.set(elemPrefix);
                fElemQNameBuf.append(chColon);
                fElemQNameBuf.append(elemDecl.getBaseName());
                fDocHandler->endElement(fElemQNameBuf.getRawBuffer());
            }
            else {
                fDocHandler->endElement(elemDecl.getBaseName());
            }
        }
        else
            fDocHandler->endElement(elemDecl.getFullName());

    }

    //
    //  If there are any installed advanced handlers, then lets call them
    //  with this info.
    //
    for (XMLSize_t index = 0; index < fAdvDHCount; index++)
        fAdvDHList[index]->endElement(elemDecl, uriId, isRoot, elemPrefix);

    //
    //  Dump the element depth down again. Don't let it underflow in case
    //  of malformed XML.
    //
    if (fElemDepth)
        fElemDepth--;
}